

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seismogram.cpp
# Opt level: O2

void __thiscall
CombinedSeismogramm<float,_3>::AddValue
          (CombinedSeismogramm<float,_3> *this,float time,Elastic *elastic,IndexType detectorIndex)

{
  pointer pCVar1;
  pointer pSVar2;
  ValueGetter<CombinedSeismogramm<float,_3>::Elastic,_3> *pVVar3;
  undefined4 in_EAX;
  uint uVar4;
  long lVar5;
  ulong uVar6;
  undefined4 extraout_XMM0_Da;
  Sample local_38;
  float time_local;
  
  _local_38 = CONCAT44(time,in_EAX);
  std::vector<float,_std::allocator<float>_>::push_back(&this->times,&time_local);
  uVar4 = 0;
  while( true ) {
    uVar6 = (ulong)uVar4;
    pCVar1 = (this->componentInfos).
             super__Vector_base<CombinedSeismogramm<float,_3>::ComponentInfo,_std::allocator<CombinedSeismogramm<float,_3>::ComponentInfo>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar5 = (long)(this->componentInfos).
                  super__Vector_base<CombinedSeismogramm<float,_3>::ComponentInfo,_std::allocator<CombinedSeismogramm<float,_3>::ComponentInfo>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar1;
    if ((ulong)(lVar5 / 0x28) <= uVar6) break;
    pSVar2 = (this->seismogramms).
             super__Vector_base<Seismogramm<float>,_std::allocator<Seismogramm<float>_>_>._M_impl.
             super__Vector_impl_data._M_start;
    pVVar3 = pCVar1[uVar6].getter;
    (**pVVar3->_vptr_ValueGetter)(pVVar3,elastic,lVar5 % 0x28);
    _local_38 = CONCAT44(time_local,extraout_XMM0_Da);
    Seismogramm<float>::AddValue(pSVar2 + uVar6,&local_38,detectorIndex);
    uVar4 = uVar4 + 1;
  }
  return;
}

Assistant:

void CombinedSeismogramm<Scalar, dims>::AddValue(Scalar time, const Elastic& elastic, IndexType detectorIndex)
{
    times.push_back(time);
    for (IndexType i = 0; i < componentInfos.size(); ++i)
    {
        seismogramms[i].AddValue(componentInfos[i].getter->GetValue(elastic), detectorIndex);
    }
}